

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O3

void Gia_ManQuantDupConeSupp_rec
               (Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vCis,Vec_Int_t *vObjs,
               _func_int_void_ptr_int *pFuncCiToKeep,void *pData)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint Entry;
  
  pGVar2 = p->pObjs;
  if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
LAB_00206503:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  Entry = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
  if ((-1 < (int)Entry) && ((int)Entry < (p->vCopies).nSize)) {
    if (-1 < (p->vCopies).pArray[Entry & 0x7fffffff]) {
      return;
    }
    uVar10 = (uint)*(undefined8 *)pObj;
    if ((uVar10 & 0x9fffffff) == 0x9fffffff) {
      pGVar7 = Gia_ManAppendObj(pNew);
      uVar3 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = pNew->pObjs;
      if ((pGVar2 <= pGVar7) && (pGVar7 < pGVar2 + pNew->nObjs)) {
        Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
        pGVar2 = pNew->pObjs;
        if ((pGVar2 <= pGVar7) && (pGVar7 < pGVar2 + pNew->nObjs)) {
          iVar6 = (int)((long)pGVar7 - (long)pGVar2 >> 2);
          uVar10 = iVar6 * -0x55555555;
          iVar6 = iVar6 * 0x55555556;
          if (iVar6 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (pNew->nObjs <= (int)(uVar10 & 0x7fffffff)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          Gia_ManQuantSetSuppZero(pNew);
          if (-1 < (int)*(undefined8 *)pObj) {
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          iVar5 = (*pFuncCiToKeep)(pData,(uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff);
          if (iVar5 == 0) {
            Gia_ManQuantSetSuppCi(pNew,pGVar2 + (uVar10 & 0x7fffffff));
          }
          iVar5 = (p->vCopies).nSize;
          goto joined_r0x002063c3;
        }
      }
      goto LAB_00206503;
    }
    if (((int)uVar10 < 0) || ((uVar10 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaExist.c"
                    ,0xdb,
                    "void Gia_ManQuantDupConeSupp_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *, int (*)(void *, int), void *)"
                   );
    }
    Gia_ManQuantDupConeSupp_rec
              (pNew,p,pObj + -(ulong)(uVar10 & 0x1fffffff),vCis,vObjs,pFuncCiToKeep,pData);
    Gia_ManQuantDupConeSupp_rec
              (pNew,p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vCis,vObjs,
               pFuncCiToKeep,pData);
    uVar3 = *(ulong *)pObj;
    uVar10 = Entry - ((uint)uVar3 & 0x1fffffff);
    if ((-1 < (int)uVar10) && (uVar1 = (p->vCopies).nSize, (int)uVar10 < (int)uVar1)) {
      uVar9 = (uint)(uVar3 >> 0x20);
      uVar8 = Entry - (uVar9 & 0x1fffffff);
      if ((-1 < (int)uVar8) && (uVar8 < uVar1)) {
        piVar4 = (p->vCopies).pArray;
        uVar10 = piVar4[uVar10];
        if (((int)uVar10 < 0) || (uVar1 = piVar4[uVar8], (int)uVar1 < 0)) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar6 = Gia_ManHashAnd(pNew,uVar10 ^ (uint)(uVar3 >> 0x1d) & 1,uVar1 ^ uVar9 >> 0x1d & 1);
        iVar5 = (p->vCopies).nSize;
        vCis = vObjs;
joined_r0x002063c3:
        if (iVar5 <= (int)Entry) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p->vCopies).pArray[Entry & 0x7fffffff] = iVar6;
        Vec_IntPush(vCis,Entry);
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManQuantDupConeSupp_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vCis, Vec_Int_t * vObjs, int(*pFuncCiToKeep)(void *, int), void * pData )
{
    int iLit0, iLit1, iObj = Gia_ObjId( p, pObj );
    int iLit = Gia_ObjCopyArray( p, iObj );
    if ( iLit >= 0 )
        return;
    if ( Gia_ObjIsCi(pObj) )
    {
        int iLit = Gia_ManAppendCi( pNew );
        Gia_Obj_t * pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(iLit) );
        Gia_ManQuantSetSuppZero( pNew );
        if ( !pFuncCiToKeep( pData, Gia_ObjCioId(pObj) ) )
        {
            //printf( "Collecting CI %d\n", Gia_ObjCioId(pObj)+1 );
            Gia_ManQuantSetSuppCi( pNew, pObjNew );
        }
        Gia_ObjSetCopyArray( p, iObj, iLit );
        Vec_IntPush( vCis, iObj );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManQuantDupConeSupp_rec( pNew, p, Gia_ObjFanin0(pObj), vCis, vObjs, pFuncCiToKeep, pData );
    Gia_ManQuantDupConeSupp_rec( pNew, p, Gia_ObjFanin1(pObj), vCis, vObjs, pFuncCiToKeep, pData );
    iLit0 = Gia_ObjCopyArray( p, Gia_ObjFaninId0(pObj, iObj) );
    iLit1 = Gia_ObjCopyArray( p, Gia_ObjFaninId1(pObj, iObj) );
    iLit0 = Abc_LitNotCond( iLit0, Gia_ObjFaninC0(pObj) );
    iLit1 = Abc_LitNotCond( iLit1, Gia_ObjFaninC1(pObj) );
    iLit  = Gia_ManHashAnd( pNew, iLit0, iLit1 );
    Gia_ObjSetCopyArray( p, iObj, iLit );
    Vec_IntPush( vObjs, iObj );
}